

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

int Ssw_RarManObjsAreEqual(void *pMan,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  ulong *puVar1;
  ulong *puVar2;
  word *pwVar3;
  word *pwVar4;
  long lVar5;
  
  pwVar3 = Ssw_RarObjSim((Ssw_RarMan_t *)pMan,pObj0->Id);
  pwVar4 = Ssw_RarObjSim((Ssw_RarMan_t *)pMan,pObj1->Id);
  lVar5 = 0;
  do {
    if (*(int *)(*pMan + 4) <= lVar5) {
      return 1;
    }
    puVar1 = pwVar4 + lVar5;
    puVar2 = pwVar3 + lVar5;
    lVar5 = lVar5 + 1;
  } while ((*puVar1 ^ *puVar2) ==
           (long)((ulong)(*(uint *)&pObj1->field_0x18 ^ *(uint *)&pObj0->field_0x18) << 0x3c) >>
           0x3f);
  return 0;
}

Assistant:

int Ssw_RarManObjsAreEqual( void * pMan, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Ssw_RarMan_t * p = (Ssw_RarMan_t *)pMan;
    word * pSim0 = Ssw_RarObjSim( p, pObj0->Id );
    word * pSim1 = Ssw_RarObjSim( p, pObj1->Id );
    word Flip = (pObj0->fPhase != pObj1->fPhase) ? ~(word)0 : 0;
    int w;
    for ( w = 0; w < p->pPars->nWords; w++ )
        if ( pSim0[w] ^ pSim1[w] ^ Flip )
            return 0;
    return 1;
}